

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O1

void DivVerifyInt64Uint32(void)

{
  return;
}

Assistant:

void DivVerifyInt64Uint32()
{
    TestVector< std::int64_t, std::uint32_t, OpType::Div > tests;
    TestCase< std::int64_t, std::uint32_t, OpType::Div > test = tests.GetNext();

    while (!tests.Done())
    {
      std::int64_t ret;
      if( SafeDivide(test.x, test.y, ret) != test.fExpected )
      {
         //assert(false);
         err_msg( "Error in case int64_uint32: ", test.x, test.y, test.fExpected );
      }

      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::int64_t> si(test.x);
         si /= test.y;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
         err_msg( "Error in case int64_uint32 throw: ", test.x, test.y, test.fExpected );
      }

      // Also need to test the version that assigns back out
      // to a plain int, as it has different logic
      fSuccess = true;
      try
      {
         std::int64_t x(test.x);
         x /= SafeInt<std::uint32_t>(test.y);
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
         err_msg( "Error in case int64_uint32 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}